

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O2

char * xmrig::Json::getString(Value *obj,char *key,char *defaultValue)

{
  ushort uVar1;
  ConstMemberIterator CVar2;
  
  CVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::FindMember(obj,key);
  if ((CVar2.ptr_ !=
       (Pointer)((ulong)(obj->data_).s.length * 0x20 + ((ulong)(obj->data_).s.str & 0xffffffffffff))
      ) && (uVar1 = ((CVar2.ptr_)->value).data_.f.flags, (uVar1 >> 10 & 1) != 0)) {
    defaultValue = (char *)((ulong)((CVar2.ptr_)->value).data_.s.str & 0xffffffffffff);
    if ((uVar1 >> 0xc & 1) != 0) {
      defaultValue = (char *)&(CVar2.ptr_)->value;
    }
  }
  return (char *)(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)defaultValue;
}

Assistant:

const char *xmrig::Json::getString(const rapidjson::Value &obj, const char *key, const char *defaultValue)
{
    assert(obj.IsObject());

    auto i = obj.FindMember(key);
    if (i != obj.MemberEnd() && i->value.IsString()) {
        return i->value.GetString();
    }

    return defaultValue;
}